

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::CopyImageTest::verifySourceIter(CopyImageTest *this)

{
  TestContext *testContext;
  State *pSVar1;
  ObjectWrapper *results_00;
  ResultCollector *rng_00;
  deUint32 name;
  TestLog *log_00;
  MessageBuilder *this_00;
  RenderContext *renderContext;
  MessageBuilder local_220;
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  *local_a0;
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  *srcImageLevels;
  ObjectWrapper *srcImage;
  ResultCollector *results;
  Random *rng;
  string local_78;
  allocator<char> local_41;
  string local_40;
  ScopedLogSection local_20;
  ScopedLogSection sourceSection;
  TestLog *log;
  CopyImageTest *this_local;
  
  log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  sourceSection.m_log = log_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Source image verify.",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"Source image verify.",(allocator<char> *)((long)&rng + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_20,log_00,&local_40,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)((long)&rng + 7));
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  results = (ResultCollector *)this->m_state;
  srcImage = (ObjectWrapper *)&this->m_state->results;
  srcImageLevels =
       (vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
        *)this->m_state->srcImage;
  local_a0 = &this->m_state->srcImageLevels;
  tcu::TestLog::operator<<
            (&local_220,sourceSection.m_log,(BeginMessageToken *)&tcu::TestLog::Message);
  this_00 = tcu::MessageBuilder::operator<<(&local_220,(char (*) [24])"Verifying source image.");
  tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_220);
  testContext = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  renderContext = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  rng_00 = results;
  results_00 = srcImage;
  pSVar1 = this->m_state;
  name = glu::ObjectWrapper::operator*((ObjectWrapper *)srcImageLevels);
  anon_unknown_0::render
            (testContext,renderContext,&pSVar1->textureRenderer,(ResultCollector *)results_00,
             (Random *)rng_00,name,local_a0,&this->m_srcImageInfo,VERIFY_COMPARE_REFERENCE);
  tcu::ScopedLogSection::~ScopedLogSection(&local_20);
  return;
}

Assistant:

void CopyImageTest::verifySourceIter (void)
{
	TestLog&						log					= m_testCtx.getLog();
	const tcu::ScopedLogSection		sourceSection		(log, "Source image verify.", "Source image verify.");

	de::Random&						rng					= m_state->rng;
	tcu::ResultCollector&			results				= m_state->results;
	glu::ObjectWrapper&				srcImage			= *m_state->srcImage;
	vector<ArrayBuffer<deUint8> >&	srcImageLevels		= m_state->srcImageLevels;

	log << TestLog::Message << "Verifying source image." << TestLog::EndMessage;

	render(m_testCtx, m_context.getRenderContext(), m_state->textureRenderer, results, rng, *srcImage, srcImageLevels, m_srcImageInfo, VERIFY_COMPARE_REFERENCE);
}